

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O1

int parse_jobs(pmtr_t *cfg,UT_string *em)

{
  UT_array *pUVar1;
  code *pcVar2;
  pmtr_t *ppVar3;
  int iVar4;
  uint yymajor;
  uint *__ptr;
  void *pvVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  char *tok;
  parse_t ps;
  size_t toklen;
  size_t len;
  char *buf;
  job_t job;
  char *local_2b0;
  void *local_2a8;
  parse_t local_2a0;
  size_t local_280;
  size_t local_278;
  char *local_270;
  pmtr_t *local_268;
  char *local_260;
  UT_string *local_258;
  char *local_250;
  job_t local_248;
  
  __ptr = (uint *)malloc(0x30);
  __ptr[8] = 0;
  __ptr[9] = 0;
  __ptr[10] = 0;
  __ptr[0xb] = 0;
  __ptr[4] = 0;
  __ptr[5] = 0;
  __ptr[6] = 0;
  __ptr[7] = 0;
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 0;
  __ptr[3] = 0;
  *(code **)(__ptr + 6) = utarray_str_cpy;
  *(code **)(__ptr + 8) = utarray_str_dtor;
  *(size_t *)(__ptr + 2) = 8;
  *(undefined1 **)(__ptr + 4) = (undefined1 *)0x0;
  memset(&local_248,0,0x218);
  local_248.cmdv.icd.sz = 8;
  local_248.cmdv.icd.init = (undefined1 *)0x0;
  local_248.cmdv.icd.copy = utarray_str_cpy;
  local_248.cmdv.icd.dtor = utarray_str_dtor;
  local_248.envv.d = (char *)0x0;
  local_248.envv.i = 0;
  local_248.envv.n = 0;
  local_248.envv.icd.copy = utarray_str_cpy;
  local_248.envv.icd.dtor = utarray_str_dtor;
  local_248.envv.icd.sz = 8;
  local_248.envv.icd.init = (undefined1 *)0x0;
  local_248.depv.d = (char *)0x0;
  local_248.depv.i = 0;
  local_248.depv.n = 0;
  local_248.depv.icd.copy = utarray_str_cpy;
  local_248.depv.icd.dtor = utarray_str_dtor;
  local_248.depv.icd.sz = 8;
  local_248.depv.icd.init = (undefined1 *)0x0;
  local_248.rlim.d = (char *)0x0;
  local_248.rlim.i = 0;
  local_248.rlim.n = 0;
  local_248.rlim.icd.copy = (ctor_f *)0x0;
  local_248.rlim.icd.dtor = (undefined1 *)0x0;
  local_248.rlim.icd.sz = 0x18;
  local_248.rlim.icd.init = (undefined1 *)0x0;
  local_248.cpuset.__bits[0xe] = 0;
  local_248.cpuset.__bits[0xf] = 0;
  local_248.cpuset.__bits[0xc] = 0;
  local_248.cpuset.__bits[0xd] = 0;
  local_248.cpuset.__bits[10] = 0;
  local_248.cpuset.__bits[0xb] = 0;
  local_248.cpuset.__bits[8] = 0;
  local_248.cpuset.__bits[9] = 0;
  local_248.cpuset.__bits[6] = 0;
  local_248.cpuset.__bits[7] = 0;
  local_248.cpuset.__bits[4] = 0;
  local_248.cpuset.__bits[5] = 0;
  local_248.cpuset.__bits[2] = 0;
  local_248.cpuset.__bits[3] = 0;
  local_248.cpuset.__bits[0] = 0;
  local_248.cpuset.__bits[1] = 0;
  local_248.respawn = 1;
  local_2a0.line = 1;
  local_2a0.rc = 0;
  local_2a0.em = em;
  local_2a0.job = &local_248;
  local_2a0.cfg = cfg;
  local_268 = cfg;
  local_2a8 = ParseAlloc(malloc);
  iVar4 = slurp((local_2a0.cfg)->file,&local_260,&local_278);
  if (-1 < iVar4) {
    local_270 = local_260;
    local_250 = local_260;
    yymajor = get_tok(local_260,&local_270,&local_278,&local_280,&local_2a0.line);
    if (0 < (int)yymajor) {
      uVar9 = __ptr[1];
      uVar8 = (ulong)*__ptr;
      local_258 = em;
      do {
        local_2b0 = strndup(local_270,local_280);
        uVar6 = (uint)(uVar8 + 1);
        if (uVar9 < uVar6) {
          do {
            bVar11 = uVar9 == 0;
            uVar9 = uVar9 * 2;
            if (bVar11) {
              uVar9 = 8;
            }
          } while (uVar9 < uVar6);
          pvVar5 = realloc(*(void **)(__ptr + 10),(ulong)uVar9 * *(long *)(__ptr + 2));
          *(void **)(__ptr + 10) = pvVar5;
          if (pvVar5 == (void *)0x0) {
            *__ptr = (uint)uVar8;
            __ptr[1] = uVar9;
            exit(-1);
          }
        }
        lVar7 = *(size_t *)(__ptr + 2) * uVar8;
        if (*(code **)(__ptr + 6) == (code *)0x0) {
          memcpy((void *)(lVar7 + *(long *)(__ptr + 10)),&local_2b0,*(size_t *)(__ptr + 2));
        }
        else {
          (**(code **)(__ptr + 6))(lVar7 + *(long *)(__ptr + 10),&local_2b0);
        }
        free(local_2b0);
        local_2b0 = *(char **)(*(long *)(__ptr + 10) + uVar8 * *(long *)(__ptr + 2));
        if (1 < local_268->verbose) {
          printf("token [%s] id=%d line=%d\n",local_2b0,(ulong)yymajor,(ulong)(uint)local_2a0.line);
        }
        Parse(local_2a8,yymajor,local_2b0,&local_2a0);
        if (local_2a0.rc == -1) {
          *__ptr = uVar6;
          __ptr[1] = uVar9;
          goto LAB_00105314;
        }
        local_278 = local_278 - local_280;
        local_270 = local_270 + local_280;
        yymajor = get_tok(local_250,&local_270,&local_278,&local_280,&local_2a0.line);
        uVar8 = uVar8 + 1;
      } while (0 < (int)yymajor);
      *__ptr = uVar6;
      __ptr[1] = uVar9;
      em = local_258;
    }
    if (yymajor != 0xffffffff) {
      Parse(local_2a8,0,(char *)0x0,&local_2a0);
      ppVar3 = local_268;
      if (local_2a0.rc != -1) {
        pUVar1 = local_268->jobs;
        qsort(pUVar1->d,(ulong)pUVar1->i,(pUVar1->icd).sz,order_sort);
        hash_deps(ppVar3->jobs);
      }
      goto LAB_00105314;
    }
    utstring_printf(em,"syntax error in %s line %d",(local_2a0.cfg)->file,
                    (ulong)(uint)local_2a0.line);
  }
  local_2a0.rc = -1;
LAB_00105314:
  if (__ptr[1] != 0) {
    pcVar2 = *(code **)(__ptr + 8);
    if ((pcVar2 != (code *)0x0) && (uVar8 = (ulong)*__ptr, uVar8 != 0)) {
      lVar7 = *(long *)(__ptr + 2);
      lVar10 = *(long *)(__ptr + 10);
      do {
        (*pcVar2)(lVar10);
        lVar10 = lVar10 + lVar7;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    free(*(void **)(__ptr + 10));
  }
  __ptr[1] = 0;
  free(__ptr);
  ParseFree(local_2a8,free);
  if (local_260 != (char *)0x0) {
    free(local_260);
  }
  job_fin(&local_248);
  return local_2a0.rc;
}

Assistant:

int parse_jobs(pmtr_t *cfg, UT_string *em) {
  char *buf, *c, *tok;
  size_t len,toklen;
  UT_array *toks;
  parse_t ps; /* our own parser state */ 
  void *p;    /* lemon parser */
  int id;

  utarray_new(toks,&ut_str_icd);
  job_t job;  /* "scratch" space used when parsing a job */
  job_ini(&job);
  ps.job=&job; 

  ps.cfg=cfg;
  ps.line=1; 
  ps.em=em;
  ps.rc=0;

  p = ParseAlloc(malloc);

  if (slurp(ps.cfg->file, &buf, &len) < 0) {ps.rc=-1; goto done;}
  c = buf;
  while ( (id=get_tok(buf,&c,&len,&toklen,&ps.line)) > 0) {
    tok = strndup(c,toklen); utarray_push_back(toks,&tok); free(tok); 
    tok = *(char**)utarray_back(toks);
    if (cfg->verbose >=2) printf("token [%s] id=%d line=%d\n",tok, id, ps.line);
    Parse(p, id, tok, &ps);
    if (ps.rc == -1) goto done;
    len -= toklen;
    c += toklen;
  }
  if (id == -1) {
    utstring_printf(em,"syntax error in %s line %d", ps.cfg->file, ps.line);
    ps.rc = -1;
    goto done;
  }
  Parse(p, 0, NULL, &ps);
  if (ps.rc == -1) goto done;

  /* parsing succeeded */
  utarray_sort(cfg->jobs, order_sort);
  hash_deps(cfg->jobs);

 done:
  utarray_free(toks);
  ParseFree(p, free);
  if (buf) free(buf);
  job_fin(&job);
  return ps.rc;
}